

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyDieRanges(DWARFVerifier *this,DWARFDie *Die,DieRangeInfo *ParentRI)

{
  bool bVar1;
  Tag TVar2;
  uint uVar3;
  storage_type *__x;
  raw_ostream *prVar4;
  address_range_iterator R;
  die_range_info_iterator dVar5;
  pointer pDVar6;
  uint uVar7;
  DWARFDie DVar8;
  DieRangeInfo local_118;
  undefined1 auStack_b8 [8];
  DWARFDie Child;
  undefined1 local_a0 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  DWARFAddressRangesVector Ranges;
  undefined1 local_60 [8];
  undefined1 auStack_58 [8];
  DWARFAddressRange Range;
  
  if (Die->U == (DWARFUnit *)0x0) {
    return 0;
  }
  if (Die->Die == (DWARFDebugInfoEntry *)0x0) {
    return 0;
  }
  DWARFDie::getAddressRanges
            ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
              *)local_a0,Die);
  if ((RangesOrError.field_0.TStorage.buffer[0x10] & 1U) != 0) {
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_60);
    consumeError((Error *)local_60);
    uVar7 = 1;
    if ((long *)((ulong)local_60 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_60 & 0xfffffffffffffffe) + 8))();
    }
    goto LAB_00b4bd11;
  }
  __x = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
        getStorage((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    *)local_a0);
  std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
            ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
             &RangesOrError.field_0x18,__x);
  local_118.Die.U = Die->U;
  local_118.Die.Die = Die->Die;
  local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.Ranges.
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.Ranges.
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.Ranges.
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (DWARFAddressRange *)0x0;
  local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.Children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->IsObjectFile == true) && (this->IsMachOObject == false)) {
    TVar2 = DWARFDie::getTag(Die);
    uVar7 = 0;
    if (TVar2 != DW_TAG_compile_unit) goto LAB_00b4bac4;
  }
  else {
LAB_00b4bac4:
    uVar7 = 0;
    Range.SectionIndex = (uint64_t)Die;
    for (pDVar6 = (pointer)RangesOrError._24_8_; Die = (DWARFDie *)Range.SectionIndex,
        pDVar6 != Ranges.
                  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar6 = pDVar6 + 1) {
      auStack_58 = (undefined1  [8])pDVar6->LowPC;
      Range.LowPC = pDVar6->HighPC;
      Range.HighPC = pDVar6->SectionIndex;
      if ((DWARFUnit *)pDVar6->HighPC < (DWARFUnit *)pDVar6->LowPC) {
        prVar4 = error(this);
        prVar4 = raw_ostream::operator<<(prVar4,"Invalid address range ");
        prVar4 = llvm::operator<<(prVar4,(DWARFAddressRange *)auStack_58);
        raw_ostream::operator<<(prVar4,"\n");
        uVar7 = uVar7 + 1;
      }
      else {
        R = DieRangeInfo::insert(&local_118,(DWARFAddressRange *)auStack_58);
        if (R._M_current !=
            local_118.Ranges.
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          prVar4 = error(this);
          prVar4 = raw_ostream::operator<<(prVar4,"DIE has overlapping address ranges: ");
          prVar4 = llvm::operator<<(prVar4,(DWARFAddressRange *)auStack_58);
          prVar4 = raw_ostream::operator<<(prVar4," and ");
          prVar4 = llvm::operator<<(prVar4,R._M_current);
          raw_ostream::operator<<(prVar4,"\n");
          uVar7 = uVar7 + 1;
          Die = (DWARFDie *)Range.SectionIndex;
          break;
        }
      }
    }
  }
  dVar5 = DieRangeInfo::insert(ParentRI,&local_118);
  if ((_Rb_tree_header *)dVar5._M_node != &(ParentRI->Children)._M_t._M_impl.super__Rb_tree_header)
  {
    prVar4 = error(this);
    raw_ostream::operator<<(prVar4,"DIEs have overlapping address ranges:");
    dump(this,Die,0);
    prVar4 = dump(this,(DWARFDie *)(dVar5._M_node + 1),0);
    raw_ostream::operator<<(prVar4,'\n');
    uVar7 = uVar7 + 1;
  }
  if (((((pointer)RangesOrError._24_8_ !=
         Ranges.
         super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
         _M_impl.super__Vector_impl_data._M_start) &&
       ((ParentRI->Ranges).
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (ParentRI->Ranges).
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
        _M_impl.super__Vector_impl_data._M_finish)) &&
      ((TVar2 = DWARFDie::getTag(Die), TVar2 != DW_TAG_subprogram ||
       (TVar2 = DWARFDie::getTag(&ParentRI->Die), TVar2 != DW_TAG_subprogram)))) &&
     (bVar1 = DieRangeInfo::contains(ParentRI,&local_118), !bVar1)) {
    prVar4 = error(this);
    raw_ostream::operator<<(prVar4,"DIE address ranges are not contained in its parent\'s ranges:");
    dump(this,&ParentRI->Die,0);
    prVar4 = dump(this,Die,2);
    raw_ostream::operator<<(prVar4,'\n');
    uVar7 = uVar7 + 1;
  }
  _auStack_58 = (undefined1  [16])DWARFDie::getFirstChild(Die);
  DVar8 = DWARFDie::getLastChild(Die);
  Range.SectionIndex = (uint64_t)DVar8.U;
  while( true ) {
    if (((DWARFDebugInfoEntry *)Range.LowPC == DVar8.Die) &&
       (auStack_58 == (undefined1  [8])Range.SectionIndex)) break;
    auStack_b8 = auStack_58;
    Child.U = (DWARFUnit *)Range.LowPC;
    uVar3 = verifyDieRanges(this,(DWARFDie *)auStack_b8,&local_118);
    uVar7 = uVar7 + uVar3;
    DWARFDie::iterator::operator++((iterator *)auStack_58);
  }
  DieRangeInfo::~DieRangeInfo(&local_118);
  std::_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::
  ~_Vector_base((_Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                &RangesOrError.field_0x18);
LAB_00b4bd11:
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
  ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             *)local_a0);
  return uVar7;
}

Assistant:

unsigned DWARFVerifier::verifyDieRanges(const DWARFDie &Die,
                                        DieRangeInfo &ParentRI) {
  unsigned NumErrors = 0;

  if (!Die.isValid())
    return NumErrors;

  auto RangesOrError = Die.getAddressRanges();
  if (!RangesOrError) {
    // FIXME: Report the error.
    ++NumErrors;
    llvm::consumeError(RangesOrError.takeError());
    return NumErrors;
  }

  DWARFAddressRangesVector Ranges = RangesOrError.get();
  // Build RI for this DIE and check that ranges within this DIE do not
  // overlap.
  DieRangeInfo RI(Die);

  // TODO support object files better
  //
  // Some object file formats (i.e. non-MachO) support COMDAT.  ELF in
  // particular does so by placing each function into a section.  The DWARF data
  // for the function at that point uses a section relative DW_FORM_addrp for
  // the DW_AT_low_pc and a DW_FORM_data4 for the offset as the DW_AT_high_pc.
  // In such a case, when the Die is the CU, the ranges will overlap, and we
  // will flag valid conflicting ranges as invalid.
  //
  // For such targets, we should read the ranges from the CU and partition them
  // by the section id.  The ranges within a particular section should be
  // disjoint, although the ranges across sections may overlap.  We would map
  // the child die to the entity that it references and the section with which
  // it is associated.  The child would then be checked against the range
  // information for the associated section.
  //
  // For now, simply elide the range verification for the CU DIEs if we are
  // processing an object file.

  if (!IsObjectFile || IsMachOObject || Die.getTag() != DW_TAG_compile_unit) {
    for (auto Range : Ranges) {
      if (!Range.valid()) {
        ++NumErrors;
        error() << "Invalid address range " << Range << "\n";
        continue;
      }

      // Verify that ranges don't intersect.
      const auto IntersectingRange = RI.insert(Range);
      if (IntersectingRange != RI.Ranges.end()) {
        ++NumErrors;
        error() << "DIE has overlapping address ranges: " << Range << " and "
                << *IntersectingRange << "\n";
        break;
      }
    }
  }

  // Verify that children don't intersect.
  const auto IntersectingChild = ParentRI.insert(RI);
  if (IntersectingChild != ParentRI.Children.end()) {
    ++NumErrors;
    error() << "DIEs have overlapping address ranges:";
    dump(Die);
    dump(IntersectingChild->Die) << '\n';
  }

  // Verify that ranges are contained within their parent.
  bool ShouldBeContained = !Ranges.empty() && !ParentRI.Ranges.empty() &&
                           !(Die.getTag() == DW_TAG_subprogram &&
                             ParentRI.Die.getTag() == DW_TAG_subprogram);
  if (ShouldBeContained && !ParentRI.contains(RI)) {
    ++NumErrors;
    error() << "DIE address ranges are not contained in its parent's ranges:";
    dump(ParentRI.Die);
    dump(Die, 2) << '\n';
  }

  // Recursively check children.
  for (DWARFDie Child : Die)
    NumErrors += verifyDieRanges(Child, RI);

  return NumErrors;
}